

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O2

void __thiscall QRect::translate(QRect *this,QPoint *p)

{
  (this->x1).m_i = (this->x1).m_i + (p->xp).m_i;
  (this->y1).m_i = (this->y1).m_i + (p->yp).m_i;
  (this->x2).m_i = (this->x2).m_i + (p->xp).m_i;
  (this->y2).m_i = (this->y2).m_i + (p->yp).m_i;
  return;
}

Assistant:

constexpr Int value() const noexcept { return m_i; }